

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void updateVirtualTable(Parse *pParse,SrcList *pSrc,Table *pTab,ExprList *pChanges,Expr *pRowid,
                       int *aXRef,Expr *pWhere,int onError)

{
  short sVar1;
  int p1;
  int iVar2;
  Vdbe *p;
  sqlite3 *db_00;
  int p2;
  int p3;
  int p3_00;
  VTable *zP4;
  Expr *pEVar3;
  Index *pIVar4;
  u16 local_e4;
  i16 iPk_1;
  Index *pPk_1;
  ExprList *pEStack_a0;
  i16 iPk;
  ExprList *pList;
  Expr *pRow;
  Index *pPk;
  int local_80;
  int addr;
  int eOnePass;
  int aDummy [2];
  int iCsr;
  int regRowid;
  int regRec;
  int regArg;
  int nArg;
  WhereInfo *pWInfo;
  char *pVTab;
  sqlite3 *db;
  int i;
  int ephemTab;
  Vdbe *v;
  int *aXRef_local;
  Expr *pRowid_local;
  ExprList *pChanges_local;
  Table *pTab_local;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  db_00 = pParse->db;
  zP4 = sqlite3GetVTable(db_00,pTab);
  _regArg = (WhereInfo *)0x0;
  p2 = pTab->nCol + 2;
  aDummy[0] = pSrc->a[0].iCursor;
  p1 = pParse->nTab;
  pParse->nTab = p1 + 1;
  pPk._4_4_ = sqlite3VdbeAddOp2(p,0x76,p1,p2);
  iVar2 = pParse->nMem;
  p3 = iVar2 + 1;
  pParse->nMem = p2 + pParse->nMem;
  if (pSrc->nSrc < 2) {
    p3_00 = pParse->nMem + 1;
    pParse->nMem = p3_00;
    aDummy[1] = pParse->nMem + 1;
    pParse->nMem = aDummy[1];
    _regArg = sqlite3WhereBegin(pParse,pSrc,pWhere,(ExprList *)0x0,(ExprList *)0x0,(Select *)0x0,4,0
                               );
    if (_regArg == (WhereInfo *)0x0) {
      return;
    }
    for (db._0_4_ = 0; (int)db < pTab->nCol; db._0_4_ = (int)db + 1) {
      if (aXRef[(int)db] < 0) {
        sqlite3VdbeAddOp3(p,0xaf,aDummy[0],(int)db,iVar2 + 3 + (int)db);
        sqlite3VdbeChangeP5(p,1);
      }
      else {
        sqlite3ExprCode(pParse,pChanges->a[aXRef[(int)db]].pExpr,iVar2 + 3 + (int)db);
      }
    }
    if ((pTab->tabFlags & 0x80) == 0) {
      sqlite3VdbeAddOp2(p,0x87,aDummy[0],p3);
      if (pRowid == (Expr *)0x0) {
        sqlite3VdbeAddOp2(p,0x87,aDummy[0],iVar2 + 2);
      }
      else {
        sqlite3ExprCode(pParse,pRowid,iVar2 + 2);
      }
    }
    else {
      pIVar4 = sqlite3PrimaryKeyIndex(pTab);
      sVar1 = *pIVar4->aiColumn;
      sqlite3VdbeAddOp3(p,0xaf,aDummy[0],(int)sVar1,p3);
      sqlite3VdbeAddOp2(p,0x51,iVar2 + 3 + (int)sVar1,iVar2 + 2);
    }
    local_80 = sqlite3WhereOkOnePass(_regArg,&addr);
    if (local_80 == 0) {
      sqlite3MultiWrite(pParse);
      sqlite3VdbeAddOp3(p,0x61,p3,p2,p3_00);
      sqlite3VdbeAddOp2(p,0x7f,p1,aDummy[1]);
      sqlite3VdbeAddOp3(p,0x80,p1,p3_00,aDummy[1]);
    }
    else {
      sqlite3VdbeChangeToNoop(p,pPk._4_4_);
      sqlite3VdbeAddOp1(p,0x7a,aDummy[0]);
    }
  }
  else {
    pRow = (Expr *)0x0;
    if ((pTab->tabFlags & 0x80) == 0) {
      if (pRowid == (Expr *)0x0) {
        pList = (ExprList *)sqlite3PExpr(pParse,0x4b,(Expr *)0x0,(Expr *)0x0);
      }
      else {
        pList = (ExprList *)sqlite3ExprDup(db_00,pRowid,0);
      }
    }
    else {
      pRow = (Expr *)sqlite3PrimaryKeyIndex(pTab);
      sVar1 = *((Index *)pRow)->aiColumn;
      if (aXRef[sVar1] < 0) {
        pList = (ExprList *)exprRowColumn(pParse,(int)sVar1);
      }
      else {
        pList = (ExprList *)sqlite3ExprDup(db_00,pChanges->a[aXRef[sVar1]].pExpr,0);
      }
    }
    pEStack_a0 = sqlite3ExprListAppend(pParse,(ExprList *)0x0,(Expr *)pList);
    for (db._0_4_ = 0; (int)db < pTab->nCol; db._0_4_ = (int)db + 1) {
      if (aXRef[(int)db] < 0) {
        pEVar3 = exprRowColumn(pParse,(int)db);
        pEStack_a0 = sqlite3ExprListAppend(pParse,pEStack_a0,pEVar3);
      }
      else {
        pEVar3 = sqlite3ExprDup(db_00,pChanges->a[aXRef[(int)db]].pExpr,0);
        pEStack_a0 = sqlite3ExprListAppend(pParse,pEStack_a0,pEVar3);
      }
    }
    updateFromSelect(pParse,p1,(Index *)pRow,pEStack_a0,pSrc,pWhere,(ExprList *)0x0,(Expr *)0x0);
    sqlite3ExprListDelete(db_00,pEStack_a0);
    local_80 = 0;
  }
  if (local_80 == 0) {
    if (pSrc->nSrc == 1) {
      sqlite3WhereEnd(_regArg);
    }
    pPk._4_4_ = sqlite3VdbeAddOp1(p,0x23,p1);
    for (db._0_4_ = 0; (int)db < p2; db._0_4_ = (int)db + 1) {
      sqlite3VdbeAddOp3(p,0x5e,p1,(int)db,p3 + (int)db);
    }
  }
  sqlite3VtabMakeWritable(pParse,pTab);
  sqlite3VdbeAddOp4(p,7,0,p2,p3,(char *)zP4,-0xb);
  if (onError == 0xb) {
    local_e4 = 2;
  }
  else {
    local_e4 = (u16)onError;
  }
  sqlite3VdbeChangeP5(p,local_e4);
  sqlite3MayAbort(pParse);
  if (local_80 == 0) {
    sqlite3VdbeAddOp2(p,0x26,p1,pPk._4_4_ + 1);
    sqlite3VdbeJumpHere(p,pPk._4_4_);
    sqlite3VdbeAddOp2(p,0x7a,p1,0);
  }
  else {
    sqlite3WhereEnd(_regArg);
  }
  return;
}

Assistant:

static void updateVirtualTable(
  Parse *pParse,       /* The parsing context */
  SrcList *pSrc,       /* The virtual table to be modified */
  Table *pTab,         /* The virtual table */
  ExprList *pChanges,  /* The columns to change in the UPDATE statement */
  Expr *pRowid,        /* Expression used to recompute the rowid */
  int *aXRef,          /* Mapping from columns of pTab to entries in pChanges */
  Expr *pWhere,        /* WHERE clause of the UPDATE statement */
  int onError          /* ON CONFLICT strategy */
){
  Vdbe *v = pParse->pVdbe;  /* Virtual machine under construction */
  int ephemTab;             /* Table holding the result of the SELECT */
  int i;                    /* Loop counter */
  sqlite3 *db = pParse->db; /* Database connection */
  const char *pVTab = (const char*)sqlite3GetVTable(db, pTab);
  WhereInfo *pWInfo = 0;
  int nArg = 2 + pTab->nCol;      /* Number of arguments to VUpdate */
  int regArg;                     /* First register in VUpdate arg array */
  int regRec;                     /* Register in which to assemble record */
  int regRowid;                   /* Register for ephem table rowid */
  int iCsr = pSrc->a[0].iCursor;  /* Cursor used for virtual table scan */
  int aDummy[2];                  /* Unused arg for sqlite3WhereOkOnePass() */
  int eOnePass;                   /* True to use onepass strategy */
  int addr;                       /* Address of OP_OpenEphemeral */

  /* Allocate nArg registers in which to gather the arguments for VUpdate. Then
  ** create and open the ephemeral table in which the records created from
  ** these arguments will be temporarily stored. */
  assert( v );
  ephemTab = pParse->nTab++;
  addr= sqlite3VdbeAddOp2(v, OP_OpenEphemeral, ephemTab, nArg);
  regArg = pParse->nMem + 1;
  pParse->nMem += nArg;
  if( pSrc->nSrc>1 ){
    Index *pPk = 0;
    Expr *pRow;
    ExprList *pList;
    if( HasRowid(pTab) ){
      if( pRowid ){
        pRow = sqlite3ExprDup(db, pRowid, 0);
      }else{
        pRow = sqlite3PExpr(pParse, TK_ROW, 0, 0);
      }
    }else{
      i16 iPk;      /* PRIMARY KEY column */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      assert( pPk->nKeyCol==1 );
      iPk = pPk->aiColumn[0];
      if( aXRef[iPk]>=0 ){
        pRow = sqlite3ExprDup(db, pChanges->a[aXRef[iPk]].pExpr, 0);
      }else{
        pRow = exprRowColumn(pParse, iPk);
      }
    }
    pList = sqlite3ExprListAppend(pParse, 0, pRow);

    for(i=0; i<pTab->nCol; i++){
      if( aXRef[i]>=0 ){
        pList = sqlite3ExprListAppend(pParse, pList,
          sqlite3ExprDup(db, pChanges->a[aXRef[i]].pExpr, 0)
        );
      }else{
        pList = sqlite3ExprListAppend(pParse, pList, exprRowColumn(pParse, i));
      }
    }

    updateFromSelect(pParse, ephemTab, pPk, pList, pSrc, pWhere, 0, 0);
    sqlite3ExprListDelete(db, pList);
    eOnePass = ONEPASS_OFF;
  }else{
    regRec = ++pParse->nMem;
    regRowid = ++pParse->nMem;

    /* Start scanning the virtual table */
    pWInfo = sqlite3WhereBegin(
        pParse, pSrc, pWhere, 0, 0, 0, WHERE_ONEPASS_DESIRED, 0
    );
    if( pWInfo==0 ) return;

    /* Populate the argument registers. */
    for(i=0; i<pTab->nCol; i++){
      assert( (pTab->aCol[i].colFlags & COLFLAG_GENERATED)==0 );
      if( aXRef[i]>=0 ){
        sqlite3ExprCode(pParse, pChanges->a[aXRef[i]].pExpr, regArg+2+i);
      }else{
        sqlite3VdbeAddOp3(v, OP_VColumn, iCsr, i, regArg+2+i);
        sqlite3VdbeChangeP5(v, OPFLAG_NOCHNG);/* For sqlite3_vtab_nochange() */
      }
    }
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_Rowid, iCsr, regArg);
      if( pRowid ){
        sqlite3ExprCode(pParse, pRowid, regArg+1);
      }else{
        sqlite3VdbeAddOp2(v, OP_Rowid, iCsr, regArg+1);
      }
    }else{
      Index *pPk;   /* PRIMARY KEY index */
      i16 iPk;      /* PRIMARY KEY column */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      assert( pPk->nKeyCol==1 );
      iPk = pPk->aiColumn[0];
      sqlite3VdbeAddOp3(v, OP_VColumn, iCsr, iPk, regArg);
      sqlite3VdbeAddOp2(v, OP_SCopy, regArg+2+iPk, regArg+1);
    }

    eOnePass = sqlite3WhereOkOnePass(pWInfo, aDummy);

    /* There is no ONEPASS_MULTI on virtual tables */
    assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );

    if( eOnePass ){
      /* If using the onepass strategy, no-op out the OP_OpenEphemeral coded
      ** above. */
      sqlite3VdbeChangeToNoop(v, addr);
      sqlite3VdbeAddOp1(v, OP_Close, iCsr);
    }else{
      /* Create a record from the argument register contents and insert it into
      ** the ephemeral table. */
      sqlite3MultiWrite(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regArg, nArg, regRec);
#if defined(SQLITE_DEBUG) && !defined(SQLITE_ENABLE_NULL_TRIM)
      /* Signal an assert() within OP_MakeRecord that it is allowed to
      ** accept no-change records with serial_type 10 */
      sqlite3VdbeChangeP5(v, OPFLAG_NOCHNG_MAGIC);
#endif
      sqlite3VdbeAddOp2(v, OP_NewRowid, ephemTab, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, ephemTab, regRec, regRowid);
    }
  }


  if( eOnePass==ONEPASS_OFF ){
    /* End the virtual table scan */
    if( pSrc->nSrc==1 ){
      sqlite3WhereEnd(pWInfo);
    }

    /* Begin scannning through the ephemeral table. */
    addr = sqlite3VdbeAddOp1(v, OP_Rewind, ephemTab); VdbeCoverage(v);

    /* Extract arguments from the current row of the ephemeral table and
    ** invoke the VUpdate method.  */
    for(i=0; i<nArg; i++){
      sqlite3VdbeAddOp3(v, OP_Column, ephemTab, i, regArg+i);
    }
  }
  sqlite3VtabMakeWritable(pParse, pTab);
  sqlite3VdbeAddOp4(v, OP_VUpdate, 0, nArg, regArg, pVTab, P4_VTAB);
  sqlite3VdbeChangeP5(v, onError==OE_Default ? OE_Abort : onError);
  sqlite3MayAbort(pParse);

  /* End of the ephemeral table scan. Or, if using the onepass strategy,
  ** jump to here if the scan visited zero rows. */
  if( eOnePass==ONEPASS_OFF ){
    sqlite3VdbeAddOp2(v, OP_Next, ephemTab, addr+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr);
    sqlite3VdbeAddOp2(v, OP_Close, ephemTab, 0);
  }else{
    sqlite3WhereEnd(pWInfo);
  }
}